

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOutputTypeGroup::init
          (SingleVertexArrayOutputTypeGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  OutputType outputType_;
  int t;
  InputType type;
  GLValue max_;
  SingleVertexArrayOutputTypeGroup *this_00;
  byte bVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  MultiVertexArrayTest *this_01;
  long *plVar6;
  ulong *puVar7;
  int **ppiVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  int *piVar12;
  undefined8 uVar13;
  GLValue GVar14;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  int local_198;
  undefined1 local_190 [16];
  pointer local_180;
  pointer pAStack_178;
  pointer local_170;
  SingleVertexArrayOutputTypeGroup *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  ulong local_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  string local_118;
  string local_f8;
  ulong local_d8;
  undefined1 local_d0 [16];
  int *local_c0;
  long lStack_b8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_140 = 0;
  local_168 = this;
  do {
    uVar3 = (int)local_140 - 6;
    local_d8 = local_140 - 3;
    local_198 = 2;
    do {
      lVar10 = 0;
      do {
        uVar11 = local_140;
        typeToString<int>(&local_70,local_198);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1ade8be);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar6;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_160 = &local_150;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_150 = *puVar7;
          lStack_148 = plVar4[3];
        }
        else {
          local_150 = *puVar7;
          local_160 = (ulong *)*plVar4;
        }
        local_158 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        outputType_ = (&DAT_01c36a40)[uVar11];
        deqp::gls::Array::outputTypeToString_abi_cxx11_
                  (&local_f8,(Array *)(ulong)outputType_,(OutputType)local_158);
        uVar11 = 0xf;
        if (local_160 != &local_150) {
          uVar11 = local_150;
        }
        if (uVar11 < local_f8._M_string_length + local_158) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar13 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_f8._M_string_length + local_158) goto LAB_0119180c;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_160);
        }
        else {
LAB_0119180c:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)local_f8._M_dataplus._M_p);
        }
        local_190._0_8_ = &local_180;
        ppAVar1 = (pointer *)(puVar5 + 2);
        if ((pointer *)*puVar5 == ppAVar1) {
          local_180 = *ppAVar1;
          pAStack_178 = (pointer)puVar5[3];
        }
        else {
          local_180 = *ppAVar1;
          local_190._0_8_ = (pointer *)*puVar5;
        }
        local_190._8_8_ = puVar5[1];
        *puVar5 = ppAVar1;
        puVar5[1] = 0;
        *(undefined1 *)ppAVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append(local_190);
        ppiVar8 = (int **)(plVar4 + 2);
        if ((int **)*plVar4 == ppiVar8) {
          local_c0 = *ppiVar8;
          lStack_b8 = plVar4[3];
          local_d0._0_8_ = &local_c0;
        }
        else {
          local_c0 = *ppiVar8;
          local_d0._0_8_ = (int **)*plVar4;
        }
        local_d0._8_8_ = plVar4[1];
        *plVar4 = (long)ppiVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        t = *(int *)((long)&DAT_01c06180 + lVar10);
        typeToString<int>(&local_118,t);
        piVar12 = (int *)0xf;
        if ((int **)local_d0._0_8_ != &local_c0) {
          piVar12 = local_c0;
        }
        if (piVar12 < (int *)(local_118._M_string_length + local_d0._8_8_)) {
          uVar13 = (int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            uVar13 = local_118.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < (int *)(local_118._M_string_length + local_d0._8_8_))
          goto LAB_0119194a;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,local_d0._0_8_);
        }
        else {
LAB_0119194a:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_d0,(ulong)local_118._M_dataplus._M_p);
        }
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_128 = *plVar4;
          uStack_120 = puVar5[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar4;
          local_138 = (long *)*puVar5;
        }
        local_130 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((int **)local_d0._0_8_ != &local_c0) {
          operator_delete((void *)local_d0._0_8_,(long)local_c0 + 1);
        }
        if ((pointer *)local_190._0_8_ != &local_180) {
          operator_delete((void *)local_190._0_8_,(ulong)((long)&local_180->inputType + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        type = local_168->m_type;
        if ((((INPUTTYPE_HALF < type) || ((0x203U >> (type & 0x1f) & 1) == 0)) || (5 < local_d8)) &&
           ((type & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10 || 5 < local_d8)) {
          bVar9 = INPUTTYPE_INT < type | 0x67U >> ((byte)type & 0x1f);
          bVar2 = INPUTTYPE_UNSIGNED_INT < type | (byte)(0x9f >> ((byte)type & 0x1f));
          if (type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            if ((byte)((uVar3 < 0xfffffffd | bVar2) & (local_140 < 6 | bVar9) & local_198 == 4) == 1
               ) {
LAB_01191b93:
              GVar14 = deqp::gls::GLValue::getMinValue(type);
              aStack_38 = GVar14.field_1;
              local_40 = GVar14.type;
              GVar14 = deqp::gls::GLValue::getMaxValue(local_168->m_type);
              aStack_48 = GVar14.field_1;
              local_50 = GVar14.type;
              max_._4_4_ = uStack_4c;
              max_.type = local_50;
              GVar14._4_4_ = uStack_3c;
              GVar14.type = local_40;
              GVar14.field_1 = aStack_38;
              max_.field_1 = aStack_48;
              deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                        ((ArraySpec *)local_d0,type,outputType_,STORAGE_USER,USAGE_DYNAMIC_DRAW,
                         local_198,0,0,false,GVar14,max_);
              local_180 = (pointer)0x0;
              pAStack_178 = (pointer)0x0;
              local_170 = (pointer)0x0;
              local_190._4_4_ = t;
              local_190._0_4_ = 1;
              local_190._8_8_ = local_190._8_8_ & 0xffffffff00000000;
              std::
              vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
              ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                        ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                          *)&local_180,(iterator)0x0,(ArraySpec *)local_d0);
              this_00 = local_168;
              this_01 = (MultiVertexArrayTest *)operator_new(0xe0);
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_01,(this_00->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,((this_00->super_TestCaseGroup).m_context)->m_renderCtx,
                         (Spec *)local_190,(char *)local_138,(char *)local_138);
              tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
              if (local_180 != (pointer)0x0) {
                operator_delete(local_180,(long)local_170 - (long)local_180);
              }
            }
          }
          else if ((byte)((local_140 < 6 | bVar9) &
                          (type != INPUTTYPE_INT_2_10_10_10 || local_198 == 4) &
                         (uVar3 < 0xfffffffd | bVar2)) != 0) goto LAB_01191b93;
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 == 4);
      local_198 = local_198 + 1;
    } while (local_198 != 5);
    local_140 = local_140 + 1;
    if (local_140 == 9) {
      return 5;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayOutputTypeGroup::init (void)
{
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4, Array::OUTPUTTYPE_IVEC2, Array::OUTPUTTYPE_IVEC3, Array::OUTPUTTYPE_IVEC4, Array::OUTPUTTYPE_UVEC2, Array::OUTPUTTYPE_UVEC3, Array::OUTPUTTYPE_UVEC4 };
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					std::string name = "components" + typeToString(componentCount) + "_" + Array::outputTypeToString(outputTypes[outputTypeNdx]) + "_quads" + typeToString(counts[countNdx]);

					const bool inputIsSignedInteger		= m_type == Array::INPUTTYPE_INT || m_type == Array::INPUTTYPE_SHORT || m_type == Array::INPUTTYPE_BYTE;
					const bool inputIsUnignedInteger	= m_type == Array::INPUTTYPE_UNSIGNED_INT || m_type == Array::INPUTTYPE_UNSIGNED_SHORT || m_type == Array::INPUTTYPE_UNSIGNED_BYTE;
					const bool outputIsSignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC4;
					const bool outputIsUnsignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC4;

					// If input type is float type and output type is int type skip
					if ((m_type == Array::INPUTTYPE_FLOAT ||  m_type == Array::INPUTTYPE_HALF || m_type == Array::INPUTTYPE_FIXED) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					// Loading signed data as unsigned causes undefined values and vice versa
					if (inputIsSignedInteger && outputIsUnsignedInteger)
						continue;
					if (inputIsUnignedInteger && outputIsSignedInteger)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	outputTypes[outputTypeNdx],
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	0,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}